

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asc2log.c
# Opt level: O0

void calc_tv(timeval *tv,timeval *read_tv,timeval *date_tv,char timestamps,int dplace)

{
  int dplace_local;
  char timestamps_local;
  timeval *date_tv_local;
  timeval *read_tv_local;
  timeval *tv_local;
  
  if (dplace == 4) {
    read_tv->tv_usec = read_tv->tv_usec * 100;
  }
  if (dplace == 5) {
    read_tv->tv_usec = read_tv->tv_usec * 10;
  }
  if (timestamps == 'a') {
    tv->tv_sec = date_tv->tv_sec + read_tv->tv_sec;
    tv->tv_usec = date_tv->tv_usec + read_tv->tv_usec;
  }
  else {
    if (((tv->tv_sec == 0) && (tv->tv_usec == 0)) &&
       ((date_tv->tv_sec != 0 || (date_tv->tv_usec != 0)))) {
      tv->tv_sec = date_tv->tv_sec;
      tv->tv_usec = date_tv->tv_usec;
    }
    tv->tv_sec = read_tv->tv_sec + tv->tv_sec;
    tv->tv_usec = read_tv->tv_usec + tv->tv_usec;
  }
  if (999999 < tv->tv_usec) {
    tv->tv_usec = tv->tv_usec + -1000000;
    tv->tv_sec = tv->tv_sec + 1;
  }
  return;
}

Assistant:

static void calc_tv(struct timeval *tv, struct timeval *read_tv,
		    struct timeval *date_tv, char timestamps, int dplace)
{
	if (dplace == 4) /* shift values having only 4 decimal places */
		read_tv->tv_usec *= 100;                /* and need for 6 */

	if (dplace == 5) /* shift values having only 5 decimal places */
		read_tv->tv_usec *= 10;                /* and need for 6 */

	if (timestamps == 'a') { /* absolute */

		tv->tv_sec  = date_tv->tv_sec  + read_tv->tv_sec;
		tv->tv_usec = date_tv->tv_usec + read_tv->tv_usec;

	} else { /* relative */

		if (((!tv->tv_sec) && (!tv->tv_usec)) && 
		    (date_tv->tv_sec || date_tv->tv_usec)) {
			tv->tv_sec  = date_tv->tv_sec; /* initial date/time */
			tv->tv_usec = date_tv->tv_usec;
		}

		tv->tv_sec  += read_tv->tv_sec;
		tv->tv_usec += read_tv->tv_usec;
	}

	if (tv->tv_usec >= 1000000) {
		tv->tv_usec -= 1000000;
		tv->tv_sec++;
	}
}